

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Gemm_x86::forward
          (Gemm_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  _func_int **pp_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  _func_int *p_Var12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int j;
  uint uVar19;
  undefined4 uVar20;
  size_t sVar21;
  int iVar22;
  Mat *pMVar23;
  Mat *pMVar24;
  int iVar25;
  int *piVar26;
  ulong uVar27;
  int iVar28;
  bool bVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  Mat *local_308;
  Mat *local_2f0;
  Mat *local_2e8;
  int TILE_K;
  ulong local_2c8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2b8;
  Gemm_x86 *local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  Mat *local_288;
  int TILE_K_1;
  Mat local_278;
  ulong local_230;
  Mat local_228;
  ulong local_1d8;
  ulong local_1d0;
  Mat local_1c8;
  Mat local_178;
  Mat *local_128;
  ulong local_120;
  Mat local_118;
  ulong local_d0;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  uint local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  int TILE_K_2;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  p_Var12 = this->_vptr_Gemm_x86[-3];
  iVar30 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar32 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
    if (iVar30 != 0) {
      if (iVar32 == 0) {
        uVar16 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar16 = pMVar1->w;
      }
      goto LAB_004536a0;
    }
    if (iVar32 == 0) {
      uVar16 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
    else {
      uVar16 = pMVar1->w;
    }
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var12) == 0) {
      uVar19 = pMVar1[1].w;
    }
    else {
      uVar19 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
    }
  }
  else if (iVar30 == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = *(uint *)(&this->field_0xec + (long)p_Var12);
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var12) == 0) {
      uVar19 = pMVar1->w;
    }
    else {
      uVar19 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
  }
  else {
    uVar16 = *(uint *)(&this->field_0xec + (long)p_Var12);
LAB_004536a0:
    uVar19 = *(uint *)(&this->field_0xf0 + (long)p_Var12);
  }
  local_278.cstep = 0;
  iVar30 = 0;
  uVar31 = 0;
  iVar32 = 0;
  iVar33 = 0;
  local_278.data = (void *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elempack = 0;
  local_278.allocator = (Allocator *)0x0;
  local_278.dims = 0;
  local_278.w = 0;
  local_278.h = 0;
  local_278.d = 0;
  local_278.c = 0;
  p_Var12 = this->_vptr_Gemm_x86[-3];
  local_2a8 = this;
  if (*(int *)(&this->field_0xe8 + (long)p_Var12) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar17 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    iVar25 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
    if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
      if (iVar25 == 0) {
        bVar29 = true;
        if (lVar17 == 0xd8) {
          local_278.data = pMVar1[2].data;
          piVar26 = pMVar1[2].refcount;
          sVar21 = pMVar1[2].elemsize;
          local_278.elempack = pMVar1[2].elempack;
          local_278.allocator = pMVar1[2].allocator;
          iVar30 = pMVar1[2].dims;
          uVar31 = pMVar1[2].w;
          iVar32 = pMVar1[2].h;
          iVar33 = pMVar1[2].d;
          local_278.c = pMVar1[2].c;
          local_278.cstep = pMVar1[2].cstep;
          if (piVar26 == (int *)0x0) {
            piVar26 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar26 = *piVar26 + 1;
            UNLOCK();
            LOCK();
            *piVar26 = *piVar26 + 1;
            UNLOCK();
            bVar29 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar21 = 0;
          piVar26 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar26,0);
        local_278.refcount._4_4_ = (undefined4)((ulong)piVar26 >> 0x20);
        local_278.elemsize._0_4_ = (undefined4)sVar21;
        local_278.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
        local_278.dims = iVar30;
        local_278.w = uVar31;
        local_278.h = iVar32;
        local_278.d = iVar33;
        if (!bVar29) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_00455b56;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
      else {
        bVar29 = true;
        if (lVar17 == 0x90) {
          local_278.data = pMVar1[1].data;
          piVar26 = pMVar1[1].refcount;
          sVar21 = pMVar1[1].elemsize;
          local_278.elempack = pMVar1[1].elempack;
          local_278.allocator = pMVar1[1].allocator;
          iVar30 = pMVar1[1].dims;
          uVar31 = pMVar1[1].w;
          iVar32 = pMVar1[1].h;
          iVar33 = pMVar1[1].d;
          local_278.c = pMVar1[1].c;
          local_278.cstep = pMVar1[1].cstep;
          if (piVar26 == (int *)0x0) {
            piVar26 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar26 = *piVar26 + 1;
            UNLOCK();
            LOCK();
            *piVar26 = *piVar26 + 1;
            UNLOCK();
            bVar29 = false;
          }
        }
        else {
          local_278.cstep = 0;
          local_278.c = 0;
          local_278.allocator = (Allocator *)0x0;
          local_278.elempack = 0;
          sVar21 = 0;
          piVar26 = (int *)0x0;
          local_278.data = (void *)0x0;
        }
        local_278.refcount._0_4_ = SUB84(piVar26,0);
        local_278.refcount._4_4_ = (undefined4)((ulong)piVar26 >> 0x20);
        local_278.elemsize._0_4_ = (undefined4)sVar21;
        local_278.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
        local_278.dims = iVar30;
        local_278.w = uVar31;
        local_278.h = iVar32;
        local_278.d = iVar33;
        if (!bVar29) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_278.allocator == (Allocator *)0x0) goto LAB_00455b56;
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
    }
    else if (iVar25 == 0) {
      bVar29 = true;
      if (lVar17 == 0x90) {
        local_278.data = pMVar1[1].data;
        piVar26 = pMVar1[1].refcount;
        sVar21 = pMVar1[1].elemsize;
        local_278.elempack = pMVar1[1].elempack;
        local_278.allocator = pMVar1[1].allocator;
        iVar30 = pMVar1[1].dims;
        uVar31 = pMVar1[1].w;
        iVar32 = pMVar1[1].h;
        iVar33 = pMVar1[1].d;
        local_278.c = pMVar1[1].c;
        local_278.cstep = pMVar1[1].cstep;
        if (piVar26 == (int *)0x0) {
          piVar26 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar26 = *piVar26 + 1;
          UNLOCK();
          LOCK();
          *piVar26 = *piVar26 + 1;
          UNLOCK();
          bVar29 = false;
        }
      }
      else {
        local_278.cstep = 0;
        local_278.c = 0;
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar21 = 0;
        piVar26 = (int *)0x0;
        local_278.data = (void *)0x0;
      }
      local_278.refcount._0_4_ = SUB84(piVar26,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)piVar26 >> 0x20);
      local_278.elemsize._0_4_ = (undefined4)sVar21;
      local_278.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
      local_278.dims = iVar30;
      local_278.w = uVar31;
      local_278.h = iVar32;
      local_278.d = iVar33;
      if (!bVar29) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_278.allocator == (Allocator *)0x0) goto LAB_00455b56;
          (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
        }
      }
    }
    else {
      bVar29 = true;
      if (lVar17 == 0x48) {
        local_278.data = pMVar1->data;
        piVar26 = pMVar1->refcount;
        sVar21 = pMVar1->elemsize;
        local_278.elempack = pMVar1->elempack;
        local_278.allocator = pMVar1->allocator;
        iVar30 = pMVar1->dims;
        uVar31 = pMVar1->w;
        iVar32 = pMVar1->h;
        iVar33 = pMVar1->d;
        local_278.c = pMVar1->c;
        local_278.cstep = pMVar1->cstep;
        if (piVar26 == (int *)0x0) {
          piVar26 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar26 = *piVar26 + 1;
          UNLOCK();
          LOCK();
          *piVar26 = *piVar26 + 1;
          UNLOCK();
          bVar29 = false;
        }
      }
      else {
        local_278.allocator = (Allocator *)0x0;
        local_278.elempack = 0;
        sVar21 = 0;
        piVar26 = (int *)0x0;
        local_278.data = (void *)0x0;
        local_278.c = 0;
        local_278.cstep = 0;
      }
      local_278.refcount._0_4_ = SUB84(piVar26,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)piVar26 >> 0x20);
      local_278.elemsize._0_4_ = (undefined4)sVar21;
      local_278.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
      local_2b8 = top_blobs;
      local_278.dims = iVar30;
      local_278.w = uVar31;
      local_278.h = iVar32;
      local_278.d = iVar33;
      if (!bVar29) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_278.allocator == (Allocator *)0x0) {
LAB_00455b56:
            free(local_278.data);
          }
          else {
            (*(local_278.allocator)->_vptr_Allocator[3])(local_278.allocator);
          }
        }
      }
    }
    pvVar8 = local_2b8;
    uVar13 = (ulong)local_2b8 >> 0x20;
    local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(uVar13 << 0x20);
    if ((local_278.data != (void *)0x0) && ((long)local_278.c * local_278.cstep != 0)) {
      local_2b8._4_4_ = SUB84(pvVar8,4);
      uVar20 = local_2b8._4_4_;
      if (local_278.dims == 1) {
        uVar31 = (uint)(local_278.w * local_278.elempack == uVar16);
        if (local_278.w * local_278.elempack == uVar19) {
          uVar31 = 4;
        }
        local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                    CONCAT44(local_2b8._4_4_,uVar31);
      }
      else {
        bVar29 = local_278.dims == 2;
        local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(uVar13 << 0x20);
        if (local_278.w == 1U && bVar29) {
          local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(uVar20,(uint)(local_278.elempack * local_278.h == uVar16) * 2);
        }
        if ((local_278.w == 1U && bVar29 || bVar29) && (local_278.w == uVar19)) {
          uVar20 = (int)local_2b8;
          if (local_278.elempack * local_278.h == uVar16) {
            uVar20 = 3;
          }
          if (local_278.elempack * local_278.h == 1) {
            uVar20 = 4;
          }
          local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                      CONCAT44(local_2b8._4_4_,uVar20);
        }
      }
      if (*(float *)((long)&(this->CT_data).d + (long)this->_vptr_Gemm_x86[-3]) != 1.0) {
        local_1c8.cstep = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.elemsize._0_4_ = 0;
        local_1c8.elemsize._4_4_ = 0;
        local_1c8.elempack = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 0;
        local_1c8.w = 0;
        local_1c8.h = 0;
        local_1c8.d = 0;
        local_1c8.c = 0;
        Mat::create_like(&local_1c8,&local_278,opt->workspace_allocator);
        uVar31 = local_278.c * (int)local_278.cstep * local_278.elempack;
        pp_Var2 = this->_vptr_Gemm_x86;
        uVar15 = 0;
        uVar13 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          uVar13 = uVar15;
        }
        for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
          *(float *)((long)local_1c8.data + uVar15 * 4) =
               *(float *)((long)&(this->CT_data).d + (long)pp_Var2[-3]) *
               *(float *)((long)local_278.data + uVar15 * 4);
        }
        piVar26 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + 1;
          UNLOCK();
        }
        piVar26 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_278.allocator == (Allocator *)0x0) {
              free(local_278.data);
            }
            else {
              (*(local_278.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_278.data = local_1c8.data;
        piVar26 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        local_278.refcount._0_4_ = local_1c8.refcount._0_4_;
        local_278.refcount._4_4_ = local_1c8.refcount._4_4_;
        local_278.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
        local_278.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_278.elempack = local_1c8.elempack;
        local_278.allocator = local_1c8.allocator;
        local_278.dims = local_1c8.dims;
        local_278.w = local_1c8.w;
        local_278.h = local_1c8.h;
        local_278.d = local_1c8.d;
        local_278.c = local_1c8.c;
        local_278.cstep = local_1c8.cstep;
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              free(local_1c8.data);
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_278 != &this->CT_data) {
      piVar26 = (this->CT_data).refcount;
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + 1;
        UNLOCK();
      }
      local_278.data = (this->CT_data).data;
      piVar26 = (this->CT_data).refcount;
      local_278.refcount._0_4_ = SUB84(piVar26,0);
      local_278.refcount._4_4_ = (undefined4)((ulong)piVar26 >> 0x20);
      sVar21 = (this->CT_data).elemsize;
      local_278.elemsize._0_4_ = (undefined4)sVar21;
      local_278.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
      local_278.elempack = (this->CT_data).elempack;
      local_278.allocator = (this->CT_data).allocator;
      uVar3 = (this->CT_data).dims;
      uVar4 = (this->CT_data).w;
      uVar5 = (this->CT_data).h;
      uVar6 = (this->CT_data).d;
      local_278.c = (this->CT_data).c;
      local_278.cstep = (this->CT_data).cstep;
      p_Var12 = this->_vptr_Gemm_x86[-3];
      local_278.dims = uVar3;
      local_278.w = uVar4;
      local_278.h = uVar5;
      local_278.d = uVar6;
    }
    local_2b8 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                CONCAT44(local_2b8._4_4_,*(undefined4 *)(&this->field_0xf8 + (long)p_Var12));
  }
  p_Var12 = this->_vptr_Gemm_x86[-3];
  if (opt->use_packing_layout == true) {
    uVar31 = uVar19;
    if (*(int *)(&this->field_0x108 + (long)p_Var12) == 0) {
      uVar31 = uVar16;
    }
    local_120 = (ulong)((uint)((uVar31 & 3) == 0) * 3 + 1);
  }
  else {
    local_120 = 1;
  }
  if (*(uint *)(&this->field_0x100 + (long)p_Var12) != 0) {
    local_120 = (ulong)*(uint *)(&this->field_0x100 + (long)p_Var12);
  }
  iVar30 = (int)local_120;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar31 = uVar19;
  if (*(int *)(&this->field_0x108 + (long)p_Var12) != 0) {
    uVar31 = uVar16;
    uVar16 = uVar19;
  }
  if (*(int *)(&this->field_0xfc + (long)p_Var12) == 0) {
    Mat::create(this_00,uVar31,(int)uVar16 / iVar30,(ulong)(uint)(iVar30 * 4),iVar30,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar31,1,(int)uVar16 / iVar30,(ulong)(uint)(iVar30 * 4),iVar30,
                opt->blob_allocator);
  }
  iVar30 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004558e3;
  iVar30 = this->nT;
  iVar32 = iVar30;
  if (iVar30 == 0) {
    iVar32 = opt->num_threads;
  }
  if (opt->num_threads != iVar30 && iVar30 != 0) {
    fprintf(_stderr,"opt.num_threads %d changed, gemm will use load-time value %d");
    fputc(10,_stderr);
  }
  p_Var12 = this->_vptr_Gemm_x86[-3];
  iVar30 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var12 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var12) == 0) {
    pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar30 == 0) {
      iVar30 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
      iVar33 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var12);
      if (iVar30 == 0) {
        iVar25 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
        iVar9 = pMVar24->w;
      }
      else {
        iVar25 = pMVar24->w;
        iVar9 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
      }
      if (iVar33 == 0) {
        uVar16 = pMVar24[1].w;
      }
      else {
        uVar16 = pMVar24[1].elempack * (&pMVar24[1].h)[(ulong)(pMVar24[1].dims == 3) * 2];
      }
      local_298 = (ulong)uVar16;
      local_230 = CONCAT44(local_230._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var12));
      get_optimal_tile_mnk
                (iVar25,uVar16,iVar9,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_K,&TILE_K_1,&TILE_K_2,iVar32);
      local_d0 = (ulong)(uint)TILE_K;
      local_1d8 = CONCAT44(local_1d8._4_4_,(iVar25 + TILE_K + -1) / TILE_K);
      uVar13 = (ulong)(uint)TILE_K_2;
      iVar18 = (iVar9 + TILE_K_2 + -1) / TILE_K_2;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_2 * TILE_K,iVar18,iVar32,4,opt->workspace_allocator);
      iVar28 = ((int)local_298 + TILE_K_1 + -1) / TILE_K_1;
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      local_288 = (Mat *)(ulong)(uint)TILE_K_1;
      Mat::create(&local_228,TILE_K_2 * TILE_K_1,iVar18,iVar28,4,opt->workspace_allocator);
      iVar28 = iVar28 * iVar18;
      iVar25 = 0;
      if (iVar28 < 1) {
        iVar28 = 0;
        iVar25 = 0;
      }
      for (; pMVar23 = local_288, iVar10 = (int)local_288, iVar28 != iVar25; iVar25 = iVar25 + 1) {
        iVar11 = (iVar25 / iVar18) * iVar10;
        iVar22 = (int)((long)iVar25 % (long)iVar18) * TILE_K_2;
        iVar14 = (int)local_298 - iVar11;
        if (iVar10 < iVar14) {
          iVar14 = iVar10;
        }
        iVar10 = iVar9 - iVar22;
        if (TILE_K_2 < iVar9 - iVar22) {
          iVar10 = TILE_K_2;
        }
        local_178.cstep = (size_t)local_228.w;
        local_178.data =
             (void *)((long)local_228.data +
                     ((long)iVar25 % (long)iVar18 & 0xffffffffU) * local_178.cstep *
                     CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize) +
                     (long)(iVar25 / iVar18) * local_228.cstep *
                     CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize));
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = (undefined4)local_228.elemsize;
        local_178.elemsize._4_4_ = local_228.elemsize._4_4_;
        local_178.elempack = local_228.elempack;
        local_178.allocator = local_228.allocator;
        local_178.dims = 2;
        local_178.w = local_228.w;
        local_178.h = 1;
        local_178.d = 1;
        local_178.c = 1;
        if (iVar33 == 0) {
          transpose_pack_B_tile(pMVar24 + 1,&local_178,iVar11,iVar14,iVar22,iVar10);
        }
        else {
          pack_B_tile(pMVar24 + 1,&local_178,iVar11,iVar14,iVar22,iVar10);
        }
      }
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.allocator = (Allocator *)0x0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      if ((((int)local_230 != 0) || ((int)local_2b8 == 3)) || (TILE_K_2 < iVar9)) {
        Mat::create(&local_178,iVar10 * (int)local_d0,1,iVar32,4,opt->workspace_allocator);
      }
      local_1d0 = CONCAT71(local_1d0._1_7_,(int)local_230 == 0);
      local_128 = (Mat *)0x0;
      iVar32 = (int)local_1d8;
      if ((int)local_1d8 < 1) {
        iVar32 = 0;
      }
      local_1d8 = CONCAT44(local_1d8._4_4_,iVar32);
      uVar15 = local_120;
      uVar27 = local_298;
      local_290 = uVar13;
      while( true ) {
        this = local_2a8;
        iVar32 = (int)uVar15;
        if ((int)local_128 == (int)local_1d8) break;
        if (iVar30 == 0) {
          iVar32 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
          iVar33 = pMVar24->w;
        }
        else {
          iVar32 = pMVar24->w;
          iVar33 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
        }
        local_2a0 = CONCAT44(local_2a0._4_4_,iVar33);
        iVar25 = (int)local_d0;
        uVar16 = (int)local_128 * iVar25;
        local_2c8 = (ulong)uVar16;
        iVar32 = iVar32 - uVar16;
        if (iVar25 < iVar32) {
          iVar32 = iVar25;
        }
        local_118.cstep = 0;
        local_118.data = (void *)0x0;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.elemsize._0_4_ = 0;
        local_118.elemsize._4_4_ = 0;
        local_118.elempack = 0;
        local_118.h = 0;
        local_118.d = 0;
        local_118.c = 0;
        local_118.allocator = (Allocator *)0x0;
        local_118.dims = 0;
        local_118.w = 0;
        if ((((int)local_230 != 0) || ((int)local_2b8 == 3)) || ((int)uVar13 < iVar33)) {
          iVar33 = get_omp_thread_num();
          uVar7 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
          local_118.cstep =
               ((long)local_178.w * (long)local_178.h * uVar7 + 0xf & 0xfffffffffffffff0) / uVar7;
          if (local_178.dims == 4) {
            local_118.cstep = (long)local_178.w * (long)local_178.h;
          }
          local_118.dims = local_178.dims + -1;
          local_118.data = (void *)((long)iVar33 * uVar7 * local_178.cstep + (long)local_178.data);
          local_118.elemsize._0_4_ = (undefined4)local_178.elemsize;
          local_118.elemsize._4_4_ = local_178.elemsize._4_4_;
          local_118.elempack = local_178.elempack;
          local_118.allocator = local_178.allocator;
          local_118.w = local_178.w;
          local_118.h = local_178.h;
          local_118.d = 1;
          local_118.c = local_178.d;
        }
        local_118.refcount._4_4_ = 0;
        local_118.refcount._0_4_ = 0;
        for (iVar33 = 0; iVar25 = (int)uVar27 - iVar33, iVar25 != 0 && iVar33 <= (int)uVar27;
            iVar33 = iVar33 + (int)local_288) {
          if ((int)pMVar23 < iVar25) {
            iVar25 = (int)pMVar23;
          }
          local_308 = &local_278;
          if ((int)local_2b8 == 3) {
            local_308 = &local_118;
            pack_A_tile(&local_278,local_308,(int)local_2c8,iVar32,iVar33,iVar25);
          }
          iVar9 = (int)local_2a0;
          iVar18 = (int)local_2a0;
          iVar28 = 0;
          while (uVar13 = local_290, iVar28 < iVar9) {
            iVar14 = (int)local_290;
            iVar10 = iVar18;
            if (iVar14 < iVar18) {
              iVar10 = iVar14;
            }
            iVar9 = get_omp_thread_num();
            local_b8 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
            local_88 = (size_t)local_1c8.w;
            _TILE_M = (void *)((long)local_1c8.data +
                              local_b8 * local_88 * (long)(iVar28 / iVar14) +
                              (long)iVar9 * local_1c8.cstep * local_b8);
            local_c0 = (int *)0x0;
            local_b0 = local_1c8.elempack;
            local_a8 = local_1c8.allocator;
            local_a0 = 2;
            local_9c = local_1c8.w;
            local_98._0_4_ = 1;
            local_98._4_4_ = 1;
            local_90 = 1;
            local_68 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
            local_38 = (size_t)local_228.w;
            _TILE_N = (void *)((long)local_228.data +
                              local_38 * local_68 * (long)(iVar28 / iVar14) +
                              (long)(iVar33 / (int)local_288) * local_228.cstep * local_68);
            local_70 = (int *)0x0;
            local_60 = local_228.elempack;
            local_58 = local_228.allocator;
            local_4c = local_228.w;
            local_48._0_4_ = 1;
            local_48._4_4_ = 1;
            local_50 = local_a0;
            local_40 = local_90;
            if (iVar33 == 0) {
              if (iVar30 == 0) {
                pack_A_tile(pMVar24,(Mat *)&TILE_M,(int)local_2c8,iVar32,iVar28,iVar10);
              }
              else {
                transpose_pack_A_tile(pMVar24,(Mat *)&TILE_M,(int)local_2c8,iVar32,iVar28,iVar10);
              }
            }
            iVar9 = (int)local_2a0;
            gemm_transB_packed_tile
                      ((Mat *)&TILE_M,(Mat *)&TILE_N,local_308,&local_118,this_00,(int)local_2b8,
                       (int)local_2c8,iVar32,iVar33,iVar25,iVar28,iVar10,
                       (bool)((int)local_2a0 <= iVar28 + iVar14 & (byte)local_1d0));
            iVar18 = iVar18 - iVar14;
            iVar28 = iVar28 + iVar14;
          }
          if ((int)local_230 != 0) {
            transpose_unpack_output_tile(&local_118,this_00,(int)local_2c8,iVar32,iVar33,iVar25);
          }
          uVar15 = local_120;
          pMVar23 = local_288;
          uVar27 = local_298;
        }
        local_128 = (Mat *)(ulong)((int)local_128 + 1);
      }
      piVar26 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar26 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar26 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_00455879;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar30 = *(int *)((long)&(this->CT_data).c + (long)p_Var12);
      local_298 = CONCAT44(local_298._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var12));
      iVar33 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      local_1d0 = CONCAT44(local_1d0._4_4_,iVar30);
      if (iVar30 == 0) {
        iVar30 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
      }
      else {
        iVar30 = pMVar24->w;
      }
      iVar25 = *(int *)(&local_2a8->field_0x108 + (long)p_Var12);
      get_optimal_tile_mnk
                (iVar30,*(int *)(&this->field_0xf0 + (long)p_Var12),iVar33,
                 *(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_N,&TILE_K,&TILE_K_1,iVar32);
      local_1d8 = (ulong)_TILE_N & 0xffffffff;
      iVar30 = (iVar30 + TILE_N + -1) / TILE_N;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_1 * TILE_N,(iVar33 + TILE_K_1 + -1) / TILE_K_1,iVar32,4,
                  opt->workspace_allocator);
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      if (((iVar25 != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < iVar33)) {
        Mat::create(&local_228,TILE_K * (int)local_1d8,1,iVar32,4,opt->workspace_allocator);
      }
      local_290 = CONCAT71(local_290._1_7_,iVar25 == 0);
      uVar13 = 0;
      if (iVar30 < 1) {
        iVar30 = 0;
      }
      local_128 = (Mat *)CONCAT44(local_128._4_4_,iVar30);
      uVar15 = local_120;
      while( true ) {
        this = local_2a8;
        iVar32 = (int)uVar15;
        if ((int)uVar13 == (int)local_128) break;
        if ((int)local_1d0 == 0) {
          iVar30 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
          iVar32 = pMVar24->w;
        }
        else {
          iVar30 = pMVar24->w;
          iVar32 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
        }
        iVar9 = (int)local_1d8;
        iVar18 = (int)uVar13 * iVar9;
        iVar33 = iVar30 - iVar18;
        if (iVar9 < iVar30 - iVar18) {
          iVar33 = iVar9;
        }
        local_178.cstep = 0;
        local_178.data = (void *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        local_230 = uVar13;
        if (((iVar25 != 0) || ((int)local_2b8 == 3)) || (TILE_K_1 < iVar32)) {
          iVar30 = get_omp_thread_num();
          uVar13 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
          local_178.cstep =
               ((long)local_228.w * (long)local_228.h * uVar13 + 0xf & 0xfffffffffffffff0) / uVar13;
          if (local_228.dims == 4) {
            local_178.cstep = (long)local_228.w * (long)local_228.h;
          }
          local_178.dims = local_228.dims + -1;
          local_178.data = (void *)((long)iVar30 * uVar13 * local_228.cstep + (long)local_228.data);
          local_178.elemsize._0_4_ = (undefined4)local_228.elemsize;
          local_178.elemsize._4_4_ = local_228.elemsize._4_4_;
          local_178.elempack = local_228.elempack;
          local_178.allocator = local_228.allocator;
          local_178.w = local_228.w;
          local_178.h = local_228.h;
          local_178.d = 1;
          local_178.c = local_228.d;
        }
        iVar30 = TILE_K;
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        uVar13 = 0;
        while( true ) {
          iVar9 = (int)uVar13;
          uVar16 = (int)local_298 - iVar9;
          if (uVar16 == 0 || (int)local_298 < iVar9) break;
          if (iVar30 < (int)uVar16) {
            uVar16 = iVar30;
          }
          local_288 = &local_278;
          if ((int)local_2b8 == 3) {
            pack_A_tile(&local_278,&local_178,iVar18,iVar33,iVar9,uVar16);
            local_288 = &local_178;
          }
          iVar9 = iVar32;
          local_2c8 = uVar13;
          local_2a0 = (ulong)uVar16;
          iVar28 = 0;
          while (uVar15 = local_120, iVar28 < iVar32) {
            iVar10 = iVar9;
            if (TILE_K_1 < iVar9) {
              iVar10 = TILE_K_1;
            }
            iVar14 = get_omp_thread_num();
            local_118.cstep = (size_t)local_1c8.w;
            local_118.data =
                 (void *)((long)local_1c8.data +
                         CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                         local_118.cstep * (long)(iVar28 / TILE_K_1) +
                         (long)iVar14 * local_1c8.cstep *
                         CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
            local_118.elemsize._4_4_ = local_1c8.elemsize._4_4_;
            local_118.elempack = local_1c8.elempack;
            local_118.allocator = local_1c8.allocator;
            local_118.dims = 2;
            local_118.w = local_1c8.w;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_b8 = (local_2a8->BT_data).elemsize;
            local_9c = (local_2a8->BT_data).w;
            local_88 = (size_t)(int)local_9c;
            local_b0 = (local_2a8->BT_data).elempack;
            local_a8 = (local_2a8->BT_data).allocator;
            local_c0 = (int *)0x0;
            _TILE_M = (void *)((long)(local_2a8->BT_data).data +
                              local_88 * local_b8 * (long)(iVar28 / TILE_K_1) +
                              (long)(int)((long)((ulong)(uint)((int)local_2c8 >> 0x1f) << 0x20 |
                                                local_2c8 & 0xffffffff) / (long)iVar30) *
                              (local_2a8->BT_data).cstep * local_b8);
            local_a0 = 2;
            local_98._0_4_ = 1;
            local_98._4_4_ = 1;
            local_90 = local_118.c;
            if ((int)local_2c8 == 0) {
              if ((int)local_1d0 == 0) {
                pack_A_tile(pMVar24,&local_118,iVar18,iVar33,iVar28,iVar10);
              }
              else {
                transpose_pack_A_tile(pMVar24,&local_118,iVar18,iVar33,iVar28,iVar10);
              }
            }
            gemm_transB_packed_tile
                      (&local_118,(Mat *)&TILE_M,local_288,&local_178,this_00,(int)local_2b8,iVar18,
                       iVar33,(int)local_2c8,(int)local_2a0,iVar28,iVar10,
                       (bool)(iVar32 <= TILE_K_1 + iVar28 & (byte)local_290));
            iVar9 = iVar9 - TILE_K_1;
            iVar28 = TILE_K_1 + iVar28;
          }
          iVar9 = (int)local_2c8;
          if (iVar25 != 0) {
            transpose_unpack_output_tile(&local_178,this_00,iVar18,iVar33,iVar9,(int)local_2a0);
          }
          uVar13 = (ulong)(uint)(iVar9 + iVar30);
        }
        uVar13 = (ulong)((int)local_230 + 1);
      }
      piVar26 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar26 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_00455879;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar16 = *(uint *)(&this->field_0xec + (long)p_Var12);
    uVar13 = (ulong)uVar16;
    iVar33 = *(int *)(&this->field_0x108 + (long)p_Var12);
    local_230 = uVar13;
    if (iVar30 == 0) {
      pMVar24 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar30 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var12);
      iVar25 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      if (iVar30 == 0) {
        uVar19 = pMVar24->w;
      }
      else {
        uVar19 = pMVar24->elempack * (&pMVar24->h)[(ulong)(pMVar24->dims == 3) * 2];
      }
      local_290 = (ulong)uVar19;
      get_optimal_tile_mnk
                (uVar16,uVar19,iVar25,*(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_N,&TILE_K,&TILE_K_1,iVar32);
      local_1d0 = (ulong)_TILE_N & 0xffffffff;
      uVar13 = (long)(int)(uVar16 + TILE_N + -1) / (long)TILE_N;
      local_2c8 = (ulong)(uint)TILE_K;
      iVar9 = ((int)local_290 + TILE_K + -1) / TILE_K;
      iVar28 = (iVar25 + TILE_K_1 + -1) / TILE_K_1;
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      Mat::create(&local_1c8,TILE_K_1 * TILE_K,iVar28,iVar9,4,opt->workspace_allocator);
      iVar9 = iVar9 * iVar28;
      iVar18 = 0;
      if (iVar9 < 1) {
        iVar9 = iVar18;
      }
      for (; iVar10 = (int)local_2c8, iVar9 != iVar18; iVar18 = iVar18 + 1) {
        iVar11 = (iVar18 / iVar28) * iVar10;
        iVar22 = (int)((long)iVar18 % (long)iVar28) * TILE_K_1;
        iVar14 = (int)local_290 - iVar11;
        if (iVar10 < iVar14) {
          iVar14 = iVar10;
        }
        iVar10 = iVar25 - iVar22;
        if (TILE_K_1 < iVar25 - iVar22) {
          iVar10 = TILE_K_1;
        }
        local_228.cstep = (size_t)local_1c8.w;
        local_228.data =
             (void *)((long)local_1c8.data +
                     ((long)iVar18 % (long)iVar28 & 0xffffffffU) * local_228.cstep *
                     CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) +
                     (long)(iVar18 / iVar28) * local_1c8.cstep *
                     CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
        local_228.elemsize._4_4_ = local_1c8.elemsize._4_4_;
        local_228.elempack = local_1c8.elempack;
        local_228.allocator = local_1c8.allocator;
        local_228.dims = 2;
        local_228.w = local_1c8.w;
        local_228.h = 1;
        local_228.d = 1;
        local_228.c = 1;
        if (iVar30 == 0) {
          transpose_pack_B_tile(pMVar24,&local_228,iVar11,iVar14,iVar22,iVar10);
        }
        else {
          pack_B_tile(pMVar24,&local_228,iVar11,iVar14,iVar22,iVar10);
        }
      }
      local_228.cstep = 0;
      local_298 = CONCAT71(local_298._1_7_,iVar33 != 0 || ((int)local_2b8 == 3 || TILE_K_1 < iVar25)
                          );
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      if (iVar33 != 0 || ((int)local_2b8 == 3 || TILE_K_1 < iVar25)) {
        Mat::create(&local_228,iVar10 * (int)local_1d0,1,iVar32,4,opt->workspace_allocator);
      }
      local_288 = (Mat *)CONCAT71(local_288._1_7_,iVar33 == 0);
      uVar27 = 0;
      this = local_2a8;
      uVar15 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar15 = uVar27;
      }
      while (iVar32 = (int)local_120, uVar27 != uVar15) {
        iVar30 = (int)local_1d0;
        iVar9 = (int)uVar27 * iVar30;
        iVar32 = (int)local_230 - iVar9;
        if (iVar30 < iVar32) {
          iVar32 = iVar30;
        }
        local_178.cstep = 0;
        local_178.data = (void *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        local_178.allocator = (Allocator *)0x0;
        local_178.dims = 0;
        local_178.w = 0;
        if ((char)local_298 != '\0') {
          iVar30 = get_omp_thread_num();
          uVar13 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
          local_178.cstep =
               ((long)local_228.w * (long)local_228.h * uVar13 + 0xf & 0xfffffffffffffff0) / uVar13;
          if (local_228.dims == 4) {
            local_178.cstep = (long)local_228.w * (long)local_228.h;
          }
          local_178.dims = local_228.dims + -1;
          local_178.data = (void *)((long)iVar30 * uVar13 * local_228.cstep + (long)local_228.data);
          local_178.elemsize._0_4_ = (undefined4)local_228.elemsize;
          local_178.elemsize._4_4_ = local_228.elemsize._4_4_;
          local_178.elempack = local_228.elempack;
          local_178.allocator = local_228.allocator;
          local_178.w = local_228.w;
          local_178.h = local_228.h;
          local_178.d = 1;
          local_178.c = local_228.d;
        }
        local_178.refcount._4_4_ = 0;
        local_178.refcount._0_4_ = 0;
        local_2a0 = uVar27;
        for (iVar30 = 0; iVar18 = (int)local_290 - iVar30, iVar18 != 0 && iVar30 <= (int)local_290;
            iVar30 = iVar30 + (int)local_2c8) {
          if ((int)local_2c8 < iVar18) {
            iVar18 = (int)local_2c8;
          }
          local_2e8 = &local_278;
          if ((int)local_2b8 == 3) {
            local_2e8 = &local_178;
            pack_A_tile(&local_278,local_2e8,iVar9,iVar32,iVar30,iVar18);
          }
          iVar28 = iVar25;
          iVar10 = 0;
          while (iVar10 < iVar25) {
            iVar14 = iVar28;
            if (TILE_K_1 < iVar28) {
              iVar14 = TILE_K_1;
            }
            sVar21 = (local_2a8->AT_data).elemsize;
            local_118.w = (local_2a8->AT_data).w;
            local_118.cstep = (size_t)local_118.w;
            local_118.elempack = (local_2a8->AT_data).elempack;
            local_118.allocator = (local_2a8->AT_data).allocator;
            local_118.data =
                 (void *)((long)(local_2a8->AT_data).data +
                         sVar21 * local_118.cstep * (long)(iVar10 / TILE_K_1) +
                         (local_2a8->AT_data).cstep * local_2a0 * sVar21);
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (undefined4)sVar21;
            local_118.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
            local_118.dims = 2;
            local_118.h = 1;
            local_118.d = 1;
            local_118.c = 1;
            local_88 = (size_t)local_1c8.w;
            local_b8 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
            _TILE_M = (void *)((long)local_1c8.data +
                              local_88 * local_b8 * (long)(iVar10 / TILE_K_1) +
                              (long)(iVar30 / (int)local_2c8) * local_1c8.cstep * local_b8);
            local_c0 = (int *)0x0;
            iVar28 = -(TILE_K_1 - iVar28);
            local_b0 = local_1c8.elempack;
            local_a8 = local_1c8.allocator;
            local_9c = local_1c8.w;
            local_98._0_4_ = 1;
            local_98._4_4_ = 1;
            local_a0 = local_118.dims;
            local_90 = local_118.c;
            gemm_transB_packed_tile
                      (&local_118,(Mat *)&TILE_M,local_2e8,&local_178,this_00,(int)local_2b8,iVar9,
                       iVar32,iVar30,iVar18,iVar10,iVar14,
                       (bool)(iVar25 <= iVar10 + TILE_K_1 & (byte)local_288));
            iVar10 = iVar10 + TILE_K_1;
          }
          if (iVar33 != 0) {
            transpose_unpack_output_tile(&local_178,this_00,iVar9,iVar32,iVar30,iVar18);
          }
          this = local_2a8;
        }
        uVar27 = local_2a0 + 1;
      }
      piVar26 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar26 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_00455879;
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar30 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      local_298 = CONCAT44(local_298._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var12));
      get_optimal_tile_mnk
                (uVar16,*(int *)(&this->field_0xf0 + (long)p_Var12),iVar30,
                 *(int *)(&this->field_0x10c + (long)p_Var12),
                 *(int *)(&this->field_0x110 + (long)p_Var12),
                 *(int *)(&this->field_0x114 + (long)p_Var12),&TILE_M,&TILE_N,&TILE_K,iVar32);
      local_1d8 = (ulong)_TILE_M & 0xffffffff;
      uVar15 = (long)(int)(uVar16 + TILE_M + -1) / (long)TILE_M;
      local_128 = (Mat *)(uVar15 & 0xffffffff);
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      local_1d0 = (ulong)(uint)TILE_K;
      local_290 = CONCAT44(local_290._4_4_,iVar30);
      iVar25 = TILE_N;
      local_d0 = CONCAT71(local_d0._1_7_,iVar33 != 0 || ((int)local_2b8 == 3 || TILE_K < iVar30));
      if (iVar33 != 0 || ((int)local_2b8 == 3 || TILE_K < iVar30)) {
        Mat::create(&local_1c8,TILE_N * TILE_M,1,iVar32,4,opt->workspace_allocator);
      }
      if ((int)uVar15 < 1) {
        local_128 = (Mat *)0x0;
      }
      iVar30 = (int)local_290;
      for (pMVar24 = (Mat *)0x0; pMVar24 != local_128; pMVar24 = (Mat *)((long)&pMVar24->data + 1))
      {
        iVar32 = (int)pMVar24 * (int)local_1d8;
        uVar16 = (int)uVar13 - iVar32;
        local_2a0 = (ulong)uVar16;
        if ((int)local_1d8 < (int)uVar16) {
          local_2a0 = local_1d8 & 0xffffffff;
        }
        local_228.cstep = 0;
        local_228.data = (void *)0x0;
        local_228.refcount._0_4_ = 0;
        local_228.refcount._4_4_ = 0;
        local_228.elemsize._0_4_ = 0;
        local_228.elemsize._4_4_ = 0;
        local_228.elempack = 0;
        local_228.h = 0;
        local_228.d = 0;
        local_228.c = 0;
        local_228.allocator = (Allocator *)0x0;
        local_228.dims = 0;
        local_228.w = 0;
        if ((char)local_d0 != '\0') {
          iVar9 = get_omp_thread_num();
          uVar13 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
          local_228.cstep =
               ((long)local_1c8.w * (long)local_1c8.h * uVar13 + 0xf & 0xfffffffffffffff0) / uVar13;
          if (local_1c8.dims == 4) {
            local_228.cstep = (long)local_1c8.w * (long)local_1c8.h;
          }
          local_228.dims = local_1c8.dims + -1;
          local_228.data = (void *)((long)iVar9 * uVar13 * local_1c8.cstep + (long)local_1c8.data);
          local_228.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
          local_228.elemsize._4_4_ = local_1c8.elemsize._4_4_;
          local_228.elempack = local_1c8.elempack;
          local_228.allocator = local_1c8.allocator;
          local_228.w = local_1c8.w;
          local_228.h = local_1c8.h;
          local_228.d = 1;
          local_228.c = local_1c8.d;
        }
        local_228.refcount._4_4_ = 0;
        local_228.refcount._0_4_ = 0;
        uVar13 = 0;
        local_288 = pMVar24;
        while( true ) {
          iVar18 = (int)uVar13;
          iVar9 = (int)local_298 - iVar18;
          if (iVar9 == 0 || (int)local_298 < iVar18) break;
          if (iVar25 < iVar9) {
            iVar9 = iVar25;
          }
          local_2f0 = &local_278;
          if ((int)local_2b8 == 3) {
            local_2f0 = &local_228;
            pack_A_tile(&local_278,local_2f0,iVar32,(int)local_2a0,iVar18,iVar9);
          }
          iVar18 = iVar30;
          local_2c8 = uVar13;
          iVar28 = 0;
          while( true ) {
            iVar10 = (int)local_2c8;
            if (iVar30 <= iVar28) break;
            iVar11 = (int)local_1d0;
            iVar14 = iVar18;
            if (iVar11 < iVar18) {
              iVar14 = iVar11;
            }
            sVar21 = (local_2a8->AT_data).elemsize;
            local_178.w = (local_2a8->AT_data).w;
            local_178.cstep = (size_t)local_178.w;
            local_178.elempack = (local_2a8->AT_data).elempack;
            local_178.allocator = (local_2a8->AT_data).allocator;
            local_178.data =
                 (void *)((long)(local_2a8->AT_data).data +
                         sVar21 * local_178.cstep * (long)(iVar28 / iVar11) +
                         (local_2a8->AT_data).cstep * (long)pMVar24 * sVar21);
            local_178.refcount._0_4_ = 0;
            local_178.refcount._4_4_ = 0;
            local_178.elemsize._0_4_ = (undefined4)sVar21;
            local_178.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
            local_178.dims = 2;
            local_178.h = 1;
            local_178.d = 1;
            local_178.c = 1;
            local_118.w = (local_2a8->BT_data).w;
            local_118.cstep = (size_t)local_118.w;
            sVar21 = (local_2a8->BT_data).elemsize;
            local_118.elempack = (local_2a8->BT_data).elempack;
            local_118.data =
                 (void *)((long)(local_2a8->BT_data).data +
                         local_118.cstep * sVar21 * (long)(iVar28 / iVar11) +
                         (long)(int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 |
                                           local_2c8 & 0xffffffff) / (long)iVar25) *
                         (local_2a8->BT_data).cstep * sVar21);
            local_118.allocator = (local_2a8->BT_data).allocator;
            iVar30 = (int)local_290;
            local_118.refcount._0_4_ = 0;
            local_118.refcount._4_4_ = 0;
            local_118.elemsize._0_4_ = (undefined4)sVar21;
            local_118.elemsize._4_4_ = (undefined4)(sVar21 >> 0x20);
            iVar18 = -(iVar11 - iVar18);
            local_118.h = 1;
            local_118.d = 1;
            local_118.dims = local_178.dims;
            local_118.c = local_178.c;
            gemm_transB_packed_tile
                      (&local_178,&local_118,local_2f0,&local_228,this_00,(int)local_2b8,iVar32,
                       (int)local_2a0,iVar10,iVar9,iVar28,iVar14,
                       (int)local_290 <= iVar28 + iVar11 && iVar33 == 0);
            pMVar24 = local_288;
            iVar28 = iVar28 + iVar11;
          }
          if (iVar33 != 0) {
            transpose_unpack_output_tile(&local_228,this_00,iVar32,(int)local_2a0,iVar10,iVar9);
          }
          uVar13 = (ulong)(uint)(iVar10 + iVar25);
        }
        uVar13 = local_230;
        this = local_2a8;
      }
      piVar26 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      iVar32 = (int)local_120;
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
LAB_00455879:
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  pp_Var2 = this->_vptr_Gemm_x86;
  if (*(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]) == 1.0) {
    iVar30 = 0;
  }
  else {
    uVar16 = iVar32 * (int)this_00->cstep * this_00->c;
    iVar30 = 0;
    uVar13 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar13 = 0;
    }
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      *(float *)((long)this_00->data + uVar15 * 4) =
           *(float *)((long)this_00->data + uVar15 * 4) *
           *(float *)((long)&(this->CT_data).h + (long)pp_Var2[-3]);
    }
  }
LAB_004558e3:
  piVar26 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        free(local_278.data);
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int Gemm_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}